

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsip.cpp
# Opt level: O2

UINT16 __thiscall tsip::b2_to_uint16(tsip *this,int bb,char r_code)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  undefined3 in_register_00000011;
  
  if (CONCAT31(in_register_00000011,r_code) == 0x65) {
    puVar2 = (undefined1 *)((long)&this->m_report + (long)bb + 2);
    puVar1 = (undefined1 *)((long)&this->m_report + (long)bb + 3);
  }
  else {
    if (CONCAT31(in_register_00000011,r_code) != 0x72) {
      return 0;
    }
    puVar2 = (undefined1 *)((long)&this->m_report + (long)bb + 1);
    puVar1 = (undefined1 *)((long)&this->m_report + (long)bb + 2);
  }
  return CONCAT11(*puVar2,*puVar1);
}

Assistant:

UINT16 tsip::b2_to_uint16(int bb, char r_code) {
	UINT16 x = 0;

	if (r_code == 'r') {
		x = (m_report.report.data[bb] << 8) + m_report.report.data[bb+1];
	} else if (r_code == 'e') {
		x = (m_report.extended.data[bb] << 8) + m_report.extended.data[bb+1];
	}

	return x;
}